

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void clunk::InitPawnMoves<false>(int from)

{
  byte bVar1;
  bool bVar2;
  int to;
  int shift;
  uint64_t mvs;
  int from_local;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x1d9,"void clunk::InitPawnMoves(const int) [color = false]");
  }
  _to = 0;
  bVar1 = 0;
  if ((from + 0xfU & 0xffffff88) == 0) {
    _to = (ulong)(from + 0x10);
    bVar1 = 8;
  }
  if ((from + 0x11U & 0xffffff88) == 0) {
    if (0x38 < bVar1) {
      __assert_fail("shift <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x1e4,"void clunk::InitPawnMoves(const int) [color = false]");
    }
    _to = (long)(from + 0x12) << bVar1 | _to;
  }
  bVar2 = VerifyMoveMap(from,_to);
  if (bVar2) {
    *(ulong *)(_pawnCaps + (long)from * 8) = _to;
    return;
  }
  __assert_fail("VerifyMoveMap(from, mvs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x1e8,"void clunk::InitPawnMoves(const int) [color = false]");
}

Assistant:

void InitPawnMoves(const int from) {
  assert(IS_SQUARE(from));
  uint64_t mvs = 0ULL;
  int shift = 0;
  int to = (from + (color ? SouthWest : NorthWest));
  if (IS_SQUARE(to)) {
    assert(shift <= 56);
    mvs |= (uint64_t(to + 1) << shift);
    shift += 8;
  }
  to = (from + (color ? SouthEast : NorthEast));
  if (IS_SQUARE(to)) {
    assert(shift <= 56);
    mvs |= (uint64_t(to + 1) << shift);
    shift += 8;
  }
  assert(VerifyMoveMap(from, mvs));
  _pawnCaps[from + (color * 8)] = mvs;
}